

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  long lVar4;
  
  if (ptr < end) {
    pbVar2 = (byte *)ptr;
    if (end == ptr || (long)end - (long)ptr < 0) {
      iVar1 = -1;
    }
    else {
      for (; (byte *)end != pbVar2 && -1 < (long)end - (long)pbVar2; pbVar2 = pbVar2 + lVar4) {
        lVar4 = 2;
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar2)) {
        case 2:
          *nextTokPtr = (char *)pbVar2;
          return 0;
        case 3:
          if (pbVar2 == (byte *)ptr) {
            iVar1 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
            return iVar1;
          }
          goto LAB_004e4df9;
        default:
          lVar4 = 1;
          break;
        case 5:
          break;
        case 6:
          lVar4 = 3;
          break;
        case 7:
          lVar4 = 4;
          break;
        case 9:
          if (pbVar2 == (byte *)ptr) {
            pcVar3 = ptr + 1;
            if (end != pcVar3 && -1 < (long)end - (long)pcVar3) {
              if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
                pcVar3 = ptr + 2;
              }
              *nextTokPtr = pcVar3;
              return 7;
            }
            return -3;
          }
          goto LAB_004e4df9;
        case 10:
          if (pbVar2 == (byte *)ptr) {
            *nextTokPtr = ptr + 1;
            return 7;
          }
          goto LAB_004e4df9;
        case 0x15:
          if (pbVar2 == (byte *)ptr) {
            *nextTokPtr = ptr + 1;
            return 0x27;
          }
          goto LAB_004e4df9;
        }
      }
LAB_004e4df9:
      *nextTokPtr = (char *)pbVar2;
      iVar1 = 6;
    }
  }
  else {
    iVar1 = -4;
  }
  return iVar1;
}

Assistant:

static int PTRCALL
PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                          const char **nextTokPtr) {
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}